

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int udp_check_url(nng_url *url,_Bool listen)

{
  int iVar1;
  
  if ((*url->u_path != '\0') && (iVar1 = strcmp(url->u_path,"/"), iVar1 != 0)) {
    return 0xf;
  }
  iVar1 = 0xf;
  if ((((url->u_fragment == (char *)0x0) && (url->u_userinfo == (char *)0x0)) &&
      (url->u_query == (char *)0x0)) &&
     ((listen || ((*url->u_hostname != '\0' && (url->u_port != 0)))))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
udp_check_url(nng_url *url, bool listen)
{
	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL)) {
		return (NNG_EADDRINVAL);
	}
	if (!listen) {
		if ((strlen(url->u_hostname) == 0) || (url->u_port == 0)) {
			return (NNG_EADDRINVAL);
		}
	}
	return (0);
}